

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_rpc(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  int *first_00;
  lys_node *plVar2;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  first_00 = (int *)(ulong)node->iffeature_size;
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_typedefs(out,(lys_tpdf *)node[1].name,node->padding[2],first_00);
  jsons_print_nodes_(out,node->child,"groupings",0x800,(int *)0x0);
  for (plVar2 = node->child; plVar2 != (lys_node *)0x0; plVar2 = plVar2->next) {
    if ((plVar2->nodetype & LYS_INPUT) != LYS_UNKNOWN) {
      jsons_print_input(out,plVar2,(int *)0x0);
      break;
    }
  }
  plVar2 = node->child;
  do {
    if (plVar2 == (lys_node *)0x0) {
LAB_0019455e:
      ly_print(out,"}");
      return;
    }
    if ((plVar2->nodetype & LYS_OUTPUT) != LYS_UNKNOWN) {
      jsons_print_output(out,plVar2,(int *)0x0);
      goto LAB_0019455e;
    }
    plVar2 = plVar2->next;
  } while( true );
}

Assistant:

static void
jsons_print_rpc(struct lyout *out, const struct lys_node *node, int *first)
{
    const struct lys_node *child;
    struct lys_node_rpc_action *rpc = (struct lys_node_rpc_action *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", rpc->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", rpc->ref, 1, NULL);
    jsons_print_status(out, rpc->flags, NULL);
    jsons_print_iffeatures(out, rpc->module, rpc->iffeature, rpc->iffeature_size, NULL);
    jsons_print_typedefs(out, rpc->tpdf, rpc->tpdf_size, NULL);
    jsons_print_groupings(out, rpc->child, NULL);

    LY_TREE_FOR(node->child, child) {
        if (!(child->nodetype & LYS_INPUT)) {
            continue;
        }
        jsons_print_input(out, child, NULL);
        break;
    }

    LY_TREE_FOR(node->child, child) {
        if (!(child->nodetype & LYS_OUTPUT)) {
            continue;
        }
        jsons_print_output(out, child, NULL);
        break;
    }
    ly_print(out, "}");
}